

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

Offset<reflection::RPCCall> __thiscall
flatbuffers::RPCCall::Serialize(RPCCall *this,FlatBufferBuilder *builder,Parser *parser)

{
  Offset<flatbuffers::String> off;
  Offset<reflection::Object> off_00;
  Offset<reflection::Object> off_01;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> off_02;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> off_03;
  Offset<reflection::RPCCall> OVar1;
  RPCCallBuilder local_40;
  
  FlatBufferBuilderImpl<false>::CreateStringImpl
            (builder,(this->super_Definition).name._M_dataplus._M_p,
             (this->super_Definition).name._M_string_length);
  off.o = (builder->buf_).size_;
  off_02 = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  off_03.o = 0;
  if ((parser->opts).binary_schema_comments == true) {
    begin._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    end._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    off_03.o = 0;
    if (begin._M_current != end._M_current) {
      off_03 = FlatBufferBuilderImpl<false>::
               CreateVectorOfStrings<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         (builder,begin,end);
    }
  }
  off_00.o = (this->request->super_Definition).serialized_location;
  off_01.o = (this->response->super_Definition).serialized_location;
  local_40.fbb_ = builder;
  FlatBufferBuilderImpl<false>::NotNested(builder);
  builder->nested = true;
  local_40.start_ = (builder->buf_).size_;
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
            (local_40.fbb_,0xc,off_03);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>>
            (local_40.fbb_,10,off_02);
  FlatBufferBuilderImpl<false>::AddOffset<reflection::Object>(local_40.fbb_,8,off_01);
  FlatBufferBuilderImpl<false>::AddOffset<reflection::Object>(local_40.fbb_,6,off_00);
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(local_40.fbb_,4,off);
  OVar1 = reflection::RPCCallBuilder::Finish(&local_40);
  return (Offset<reflection::RPCCall>)OVar1.o;
}

Assistant:

Offset<reflection::RPCCall> RPCCall::Serialize(FlatBufferBuilder *builder,
                                               const Parser &parser) const {
  auto name__ = builder->CreateString(name);
  auto attr__ = SerializeAttributes(builder, parser);
  auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                    ? builder->CreateVectorOfStrings(doc_comment)
                    : 0;
  return reflection::CreateRPCCall(
      *builder, name__, request->serialized_location,
      response->serialized_location, attr__, docs__);
}